

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_particleSpectra.cpp
# Opt level: O2

void __thiscall
singleParticleSpectra::calculate_rapidity_distribution
          (singleParticleSpectra *this,int event_id,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Qn_real,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Qn_imag,int flag)

{
  double *pdVar1;
  pointer pvVar2;
  pointer pvVar3;
  long *plVar4;
  pointer pdVar5;
  uint uVar6;
  ulong uVar7;
  vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
  *pvVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  pretty_ostream *this_00;
  int iorder;
  int iVar13;
  ulong uVar14;
  int j;
  ulong uVar15;
  double dVar16;
  double __x;
  double __y;
  allocator local_95;
  uint local_94;
  long local_90;
  double local_88;
  double dStack_80;
  double local_78;
  double local_70;
  double local_68;
  double dStack_60;
  ulong local_58;
  string local_50;
  
  uVar14 = (ulong)(uint)flag;
  uVar10 = 0;
  uVar7 = (ulong)(uint)this->order_max;
  if (this->order_max < 1) {
    uVar7 = uVar10;
  }
  uVar12 = (ulong)(uint)this->N_rap;
  if (this->N_rap < 1) {
    uVar12 = uVar10;
  }
  for (; uVar10 != uVar12; uVar10 = uVar10 + 1) {
    pvVar2 = (event_Qn_real->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pvVar3 = (event_Qn_imag->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    for (uVar15 = 0; uVar7 != uVar15; uVar15 = uVar15 + 1) {
      *(undefined8 *)
       (*(long *)&pvVar2[uVar10].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data + uVar15 * 8) = 0;
      *(undefined8 *)
       (*(long *)&pvVar3[uVar10].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data + uVar15 * 8) = 0;
    }
  }
  if (2 < (uint)flag) {
    this_00 = &this->messager;
    std::operator<<((ostream *)this_00,"calculate_rapidity_distribution: ");
    std::operator<<((ostream *)this_00,"unrecogonized flag = ");
    std::ostream::operator<<(this_00,flag);
    std::__cxx11::string::string((string *)&local_50,"error",&local_95);
    pretty_ostream::flush(this_00,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    exit(1);
  }
  local_90 = (long)event_id;
  plVar4 = *(long **)(**(long **)((long)&(((this->particle_list).
                                           super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr)->paraRdr_).names.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data +
                                 *(long *)(&DAT_00146b78 + uVar14 * 8)) + local_90 * 8);
  uVar7 = (plVar4[1] - *plVar4) / 0x78;
  uVar10 = 0;
  local_94 = flag;
  local_58 = uVar7 & 0xffffffff;
  if ((int)uVar7 < 1) {
    local_58 = uVar10;
  }
  do {
    if (uVar10 == local_58) {
      return;
    }
    iVar13 = (int)uVar14;
    if (iVar13 == 2) {
      pvVar8 = ((this->particle_list).
                super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               negative_charge_hadron_list;
LAB_00127dca:
      lVar9 = *(long *)&(pvVar8->
                        super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                        )._M_impl.super__Vector_impl_data._M_start[local_90]->
                        super__Vector_base<particle_info,_std::allocator<particle_info>_>;
      lVar11 = uVar10 * 0x78;
      pdVar1 = (double *)(lVar9 + 0x28 + lVar11);
      local_68 = *pdVar1;
      local_88 = pdVar1[1];
      local_70 = *(double *)(lVar9 + 8 + lVar11);
      iVar13 = *(int *)(lVar9 + 0x10 + lVar11);
    }
    else {
      if (iVar13 == 1) {
        pvVar8 = ((this->particle_list).
                  super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 positive_charge_hadron_list;
        goto LAB_00127dca;
      }
      if (iVar13 == 0) {
        lVar9 = *(long *)&(((this->particle_list).
                            super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                           ->particle_list->
                          super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                          )._M_impl.super__Vector_impl_data._M_start[local_90]->
                          super__Vector_base<particle_info,_std::allocator<particle_info>_>;
        lVar11 = uVar10 * 0x78;
        local_70 = *(double *)(lVar9 + 8 + lVar11);
        iVar13 = *(int *)(lVar9 + 0x10 + lVar11);
        pdVar1 = (double *)(lVar9 + 0x28 + lVar11);
        local_68 = *pdVar1;
        local_88 = pdVar1[1];
      }
      else {
        local_68 = 0.0;
        local_88 = 0.0;
        iVar13 = 0;
        local_70 = 0.0;
      }
    }
    dVar16 = local_88 * local_88 - local_70 * local_70;
    dStack_80 = local_88;
    dStack_60 = local_88;
    if (dVar16 < 0.0) {
      local_78 = sqrt(dVar16);
    }
    else {
      local_78 = SQRT(dVar16);
    }
    dVar16 = local_78;
    if (this->rap_type != 0) {
      dVar16 = local_88;
    }
    dVar16 = log((local_68 + dVar16) / (dVar16 - local_68));
    dVar16 = dVar16 * 0.5;
    if (((this->rapidity_dis_min - this->drap * 0.5 <= dVar16) &&
        (uVar6 = (uint)((dVar16 - this->rapidity_dis_min) / this->drap + 0.5), -1 < (int)uVar6)) &&
       ((int)uVar6 < this->N_rap)) {
      if (local_94 == 2) {
        lVar9 = 0x6d8;
LAB_00127f97:
        lVar9 = **(long **)(**(long **)((long)&(((this->particle_list).
                                                 super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_ptr)->paraRdr_).names.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data + lVar9) +
                           local_90 * 8);
        __x = *(double *)(lVar9 + 0x18 + uVar10 * 0x78);
        __y = *(double *)(lVar9 + 0x20 + uVar10 * 0x78);
      }
      else {
        if (local_94 == 1) {
          lVar9 = 0x6d0;
          goto LAB_00127f97;
        }
        __x = 0.0;
        __y = 0.0;
        if (local_94 == 0) {
          pdVar5 = (this->rapidity_array).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pdVar5[uVar6] = dVar16 + pdVar5[uVar6];
          pdVar5 = (this->dNdy_array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar5[uVar6] = pdVar5[uVar6] + 1.0;
          dVar16 = 1.0 - (local_68 * local_68) / (local_78 * local_78);
          if (dVar16 < 0.0) {
            dVar16 = sqrt(dVar16);
          }
          else {
            dVar16 = SQRT(dVar16);
          }
          if (iVar13 == -1) {
            local_88 = local_88 + local_70;
          }
          else if (iVar13 == 1) {
            local_88 = local_88 - local_70;
          }
          pdVar5 = (this->dETdy_array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar5[uVar6] = local_88 * dVar16 + pdVar5[uVar6];
          lVar9 = 0x6a0;
          goto LAB_00127f97;
        }
      }
      local_88 = SQRT(__x * __x + __y * __y);
      if ((this->vn_rapidity_dis_pT_min <= local_88 && local_88 != this->vn_rapidity_dis_pT_min) &&
         (local_88 < this->vn_rapidity_dis_pT_max)) {
        local_78 = atan2(__y,__x);
        pdVar1 = (event_Qn_real->
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start[uVar6].
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        *pdVar1 = *pdVar1 + 1.0;
        pdVar1 = (event_Qn_imag->
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start[uVar6].
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        *pdVar1 = local_88 + *pdVar1;
        for (lVar9 = 1; lVar9 < this->order_max; lVar9 = lVar9 + 1) {
          local_68 = (double)(int)lVar9 * local_78;
          local_88 = cos(local_68);
          dVar16 = sin(local_68);
          lVar11 = *(long *)&(event_Qn_real->
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start[uVar6].
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data;
          *(double *)(lVar11 + lVar9 * 8) = local_88 + *(double *)(lVar11 + lVar9 * 8);
          lVar11 = *(long *)&(event_Qn_imag->
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start[uVar6].
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data;
          *(double *)(lVar11 + lVar9 * 8) = dVar16 + *(double *)(lVar11 + lVar9 * 8);
        }
      }
    }
    uVar10 = uVar10 + 1;
    uVar14 = (ulong)local_94;
  } while( true );
}

Assistant:

void singleParticleSpectra::calculate_rapidity_distribution(
    int event_id, vector<vector<double>> &event_Qn_real,
    vector<vector<double>> &event_Qn_imag, int flag) {
    // first clean the results arrays
    for (int i = 0; i < N_rap; i++) {
        for (int j = 0; j < order_max; j++) {
            event_Qn_real[i][j] = 0.0;
            event_Qn_imag[i][j] = 0.0;
        }
    }

    int number_of_particles = 0;
    if (flag == 0) {
        number_of_particles = particle_list->get_number_of_particles(event_id);
    } else if (flag == 1) {
        number_of_particles =
            (particle_list->get_number_of_positive_particles(event_id));
    } else if (flag == 2) {
        number_of_particles =
            (particle_list->get_number_of_negative_particles(event_id));
    } else {
        messager << "calculate_rapidity_distribution: "
                 << "unrecogonized flag = " << flag;
        messager.flush("error");
        exit(1);
    }
    for (int i = 0; i < number_of_particles; i++) {
        double pz_local = 0.0;
        double E_local = 0.0;
        double mass = 0.0;
        int baryon = 0;
        if (flag == 0) {
            auto particle_local = particle_list->get_particle(event_id, i);
            pz_local = particle_local.pz;
            E_local = particle_local.E;
            mass = particle_local.mass;
            baryon = particle_local.baryon;
        } else if (flag == 1) {
            pz_local = particle_list->get_positive_particle(event_id, i).pz;
            E_local = particle_list->get_positive_particle(event_id, i).E;
            mass = particle_list->get_positive_particle(event_id, i).mass;
            baryon = particle_list->get_positive_particle(event_id, i).baryon;
        } else if (flag == 2) {
            pz_local = particle_list->get_negative_particle(event_id, i).pz;
            E_local = particle_list->get_negative_particle(event_id, i).E;
            mass = particle_list->get_negative_particle(event_id, i).mass;
            baryon = particle_list->get_negative_particle(event_id, i).baryon;
        }
        double pmag = sqrt(E_local * E_local - mass * mass);

        double rap_local = 0.0;
        if (rap_type == 0) {
            rap_local = 0.5 * log((pmag + pz_local) / (pmag - pz_local));
        } else {
            rap_local = 0.5 * log((E_local + pz_local) / (E_local - pz_local));
        }

        if (rap_local < rapidity_dis_min - drap / 2.) continue;

        int rap_idx =
            static_cast<int>((rap_local - rapidity_dis_min) / drap + 0.5);
        if (rap_idx < 0 || rap_idx >= N_rap) continue;

        // no pT cut on particle yield
        if (flag == 0) {
            rapidity_array[rap_idx] += rap_local;
            dNdy_array[rap_idx]++;

            // compute the transverse energy
            // ALICE https://arxiv.org/pdf/1603.04775
            // PHENIX https://arxiv.org/pdf/nucl-ex/0409015
            double sin_theta = sqrt(1. - pz_local * pz_local / (pmag * pmag));
            if (baryon == 1) {
                dETdy_array[rap_idx] += (E_local - mass) * sin_theta;
            } else if (baryon == -1) {
                dETdy_array[rap_idx] += (E_local + mass) * sin_theta;
            } else {
                dETdy_array[rap_idx] += E_local * sin_theta;
            }
        }
        // calcualte vn
        double px_local = 0.0;
        double py_local = 0.0;
        if (flag == 0) {
            px_local = particle_list->get_particle(event_id, i).px;
            py_local = particle_list->get_particle(event_id, i).py;
        } else if (flag == 1) {
            px_local = particle_list->get_positive_particle(event_id, i).px;
            py_local = particle_list->get_positive_particle(event_id, i).py;
        } else if (flag == 2) {
            px_local = particle_list->get_negative_particle(event_id, i).px;
            py_local = particle_list->get_negative_particle(event_id, i).py;
        }
        double p_perp = sqrt(px_local * px_local + py_local * py_local);
        if (p_perp > vn_rapidity_dis_pT_min
            && p_perp < vn_rapidity_dis_pT_max) {
            double p_phi = atan2(py_local, px_local);
            event_Qn_real[rap_idx][0] += 1.;
            event_Qn_imag[rap_idx][0] += p_perp;  // record mean pT
            for (int iorder = 1; iorder < order_max; iorder++) {
                double cos_nphi = cos(iorder * p_phi);
                double sin_nphi = sin(iorder * p_phi);
                event_Qn_real[rap_idx][iorder] += cos_nphi;
                event_Qn_imag[rap_idx][iorder] += sin_nphi;
            }
        }
    }
}